

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O2

bool __thiscall cppnet::EpollEventActions::DelEvent(EpollEventActions *this,Event *event)

{
  int iVar1;
  SingletonLogger *pSVar2;
  uint *puVar3;
  bool bVar4;
  shared_ptr<cppnet::Socket> sock;
  
  std::__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>,&event->_socket);
  if (sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar4 = false;
  }
  else {
    iVar1 = epoll_ctl(this->_epoll_handler,2,
                      (int)(sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_sock,(epoll_event *)event->_data);
    if (iVar1 < 0) {
      pSVar2 = Singleton<cppnet::SingletonLogger>::Instance();
      puVar3 = (uint *)__errno_location();
      bVar4 = false;
      SingletonLogger::Error
                (pSVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x10a,"remove event from EPOLL failed! error :%d, socket : %d",(ulong)*puVar3,
                 (sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_sock
                );
    }
    else {
      event->_event_type = 0;
      pSVar2 = Singleton<cppnet::SingletonLogger>::Instance();
      bVar4 = true;
      SingletonLogger::Debug
                (pSVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x10f,"remove a socket from EPOLL, %d",
                 (sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_sock
                );
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar4;
}

Assistant:

bool EpollEventActions::DelEvent(Event* event) {
    auto sock = event->GetSocket();
    if (!sock) {
        return false;
    }
    epoll_event* ev = (epoll_event*)event->GetData();
    int32_t ret = epoll_ctl(_epoll_handler, EPOLL_CTL_DEL, sock->GetSocket(), ev);
    if (ret < 0) {
        LOG_ERROR("remove event from EPOLL failed! error :%d, socket : %d", errno, sock->GetSocket());
        return false;
    }

    event->ClearType();
    LOG_DEBUG("remove a socket from EPOLL, %d", sock->GetSocket());
    return true;
}